

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O1

void __thiscall
amrex::MLNodeLaplacian::restriction
          (MLNodeLaplacian *this,int amrlev,int cmglev,MultiFab *crse,MultiFab *fine)

{
  DistributionMapping *rhs;
  int iVar1;
  pointer pIVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Periodicity *period;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  int ii;
  int iVar20;
  long lVar21;
  int iVar22;
  undefined4 in_register_00000034;
  undefined **ppuVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  uint uVar33;
  uint uVar34;
  MLNodeLaplacian *pMVar35;
  long lVar36;
  long lVar37;
  char cVar38;
  long lVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  undefined1 auVar89 [16];
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar113;
  undefined1 auVar107 [16];
  double dVar106;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar125;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  double dVar148;
  double dVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  double dVar155;
  double dVar156;
  double dVar157;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  double dVar158;
  double dVar170;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  double dVar171;
  double dVar172;
  double dVar173;
  undefined1 auVar176 [16];
  double dVar174;
  double dVar180;
  undefined1 auVar177 [16];
  double dVar175;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  double dVar181;
  double dVar182;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  double dVar189;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  double dVar194;
  double dVar195;
  double dVar196;
  double dVar197;
  int kk_1;
  int kk_3;
  int jj;
  int kk;
  Array4<double> cfab;
  MFIter mfi;
  MultiFab cfine;
  ulong in_stack_fffffffffffff8e8;
  Box local_5e4;
  double local_5c8;
  undefined8 uStack_5c0;
  long local_5b0;
  undefined **local_5a8;
  undefined **local_5a0;
  double *local_598;
  double *local_590;
  double *local_588;
  undefined **local_580;
  long local_578;
  FabArray<amrex::FArrayBox> *local_570;
  ulong local_568;
  ulong local_560;
  double *local_558;
  double *local_550;
  double *local_548;
  undefined **local_540;
  undefined **local_538;
  double *local_530;
  long local_528;
  uint local_51c;
  int local_518;
  int local_514;
  int local_510;
  int local_50c;
  double local_508;
  undefined8 uStack_500;
  double local_4f8;
  undefined8 uStack_4f0;
  double *local_4e8;
  undefined8 uStack_4e0;
  FabArray<amrex::FArrayBox> *local_4d0;
  MLNodeLaplacian *local_4c8;
  long local_4c0;
  undefined **local_4b8;
  undefined **local_4b0;
  long local_4a8;
  double *local_4a0;
  undefined1 local_498 [24];
  pointer pbStack_480;
  undefined8 local_478;
  int local_470;
  Array4<const_double> local_458;
  Array4<const_int> local_418;
  double *local_3d8;
  undefined8 uStack_3d0;
  double *local_3c8;
  undefined8 uStack_3c0;
  double *local_3b8;
  undefined8 uStack_3b0;
  double *local_3a8;
  undefined8 uStack_3a0;
  double local_398;
  undefined8 uStack_390;
  FabArray<amrex::FArrayBox> *local_388;
  long local_380;
  FabArray<amrex::IArrayBox> *local_378;
  int *local_370;
  long local_368;
  long local_360;
  long local_358;
  long local_350;
  ulong local_348;
  long local_340;
  long local_338;
  long local_330;
  long local_328;
  int *local_320;
  double *local_318;
  double *local_310;
  double *local_308;
  double *local_300;
  double *local_2f8;
  double *local_2f0;
  double *local_2e8;
  double *local_2e0;
  double *local_2d8;
  double *local_2d0;
  double *local_2c8;
  double *local_2c0;
  double *local_2b8;
  double *local_2b0;
  double *local_2a8;
  double *local_2a0;
  double *local_298;
  double *local_290;
  double *local_288;
  double *local_280;
  double *local_278;
  undefined **local_270;
  double *local_268;
  undefined **local_260;
  Array4<const_double> local_258;
  BoxArray local_218;
  FabArray<amrex::FArrayBox> local_1b0;
  
  local_4c8 = this;
  (*(this->super_MLNodeLinOp).super_MLLinOp._vptr_MLLinOp[0x45])
            (this,CONCAT44(in_register_00000034,amrlev),(ulong)(cmglev - 1U),fine,0,0,
             in_stack_fffffffffffff8e8 & 0xffffffff00000000);
  rhs = &(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  bVar6 = DistributionMapping::operator==
                    (&(crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,
                     rhs);
  bVar40 = (crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
           (fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_4d0 = &fine->super_FabArray<amrex::FArrayBox>;
  MultiFab::MultiFab((MultiFab *)&local_1b0);
  local_570 = &crse->super_FabArray<amrex::FArrayBox>;
  local_388 = &crse->super_FabArray<amrex::FArrayBox>;
  if (bVar40 || !bVar6) {
    amrex::coarsen(&local_218,
                   &(((FabArray<amrex::FArrayBox> *)&local_4d0->super_FabArrayBase)->
                    super_FabArrayBase).boxarray,2);
    local_498._0_8_ = (double *)0x1;
    local_498._8_8_ = (Arena *)0x0;
    local_498._16_8_ = (pointer)0x0;
    pbStack_480 = (pointer)0x0;
    local_478 = (pointer)0x0;
    local_458.p = (double *)&PTR__FabFactory_0074e8d0;
    local_570 = &local_1b0;
    MultiFab::define((MultiFab *)local_570,&local_218,rhs,1,0,(MFInfo *)local_498,
                     (FabFactory<amrex::FArrayBox> *)&local_458);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_498 + 0x10));
    BoxArray::~BoxArray(&local_218);
  }
  pMVar35 = local_4c8;
  local_578 = (long)(int)(cmglev - 1U);
  if (cmglev < 1) {
    bVar41 = true;
    cVar38 = '\x02';
  }
  else {
    pIVar2 = (local_4c8->super_MLNodeLinOp).super_MLLinOp.mg_coarsen_ratio_vec.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pIVar2[local_578].vect[1] == 2 && pIVar2[local_578].vect[0] == 2) {
      bVar41 = pIVar2[local_578].vect[2] == 2;
    }
    else {
      bVar41 = false;
    }
    cVar38 = '\x01';
    if (pIVar2[local_578].vect[1] != 1) {
      cVar38 = (pIVar2[local_578].vect[0] != 1) * '\x02';
    }
  }
  local_378 = *(FabArray<amrex::IArrayBox> **)
               (*(long *)&(local_4c8->super_MLNodeLinOp).m_dirichlet_mask.
                          super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[amrlev].
                          super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                          .
                          super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               + local_578 * 8);
  local_380 = *(long *)&(local_4c8->m_stencil).
                        super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[amrlev].
                        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ;
  MFIter::MFIter((MFIter *)&local_218,&local_570->super_FabArrayBase,true);
  if (local_218.m_bat.m_op.m_bndryReg.m_loshft.vect[2] <
      local_218.m_bat.m_op.m_bndryReg.m_hishft.vect[1]) {
    do {
      MFIter::tilebox(&local_5e4,(MFIter *)&local_218);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)local_498,local_570,(MFIter *)&local_218);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_458,local_4d0,(MFIter *)&local_218);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                (&local_418,local_378,(MFIter *)&local_218);
      if ((pMVar35->super_MLNodeLinOp).m_coarsening_strategy == Sigma) {
        if (bVar41) {
          local_528 = CONCAT44(local_528._4_4_,local_5e4.bigend.vect[2]);
          if (local_5e4.smallend.vect[2] <= local_5e4.bigend.vect[2]) {
            lVar32 = (long)local_5e4.smallend.vect[0];
            iVar8 = (local_5e4.bigend.vect[0] - local_5e4.smallend.vect[0]) + 1;
            local_598 = (double *)CONCAT44(local_598._4_4_,iVar8);
            local_5a0 = (undefined **)(lVar32 * 0x10);
            iVar1 = local_5e4.smallend.vect[2] * 2;
            local_530 = (double *)CONCAT44(local_530._4_4_,local_5e4.smallend.vect[1] * 2);
            local_5c8 = (double)CONCAT44(local_5c8._4_4_,local_5e4.smallend.vect[2] * 2 + 1);
            iVar11 = local_5e4.smallend.vect[2] * 2 + -1;
            iVar3 = local_5e4.smallend.vect[1] * 2 + 1;
            local_538 = (undefined **)CONCAT44(local_538._4_4_,iVar3);
            iVar4 = local_5e4.smallend.vect[1] * 2 + -1;
            local_540 = (undefined **)CONCAT44(local_540._4_4_,iVar4);
            local_5a8 = (undefined **)CONCAT44(local_5a8._4_4_,local_5e4.smallend.vect[0] * 2);
            iVar9 = local_5e4.smallend.vect[0] * 2 + -1;
            local_5b0 = CONCAT44(local_5b0._4_4_,iVar9);
            uVar7 = local_5e4.smallend.vect[2];
            do {
              if (local_5e4.smallend.vect[1] <= local_5e4.bigend.vect[1]) {
                iVar17 = uVar7 * 2;
                local_4f8 = (double)CONCAT44(local_4f8._4_4_,iVar17);
                iVar10 = uVar7 * 2 + 1;
                local_508 = (double)CONCAT44(local_508._4_4_,iVar10);
                local_590 = (double *)
                            (local_418.p +
                            lVar32 * 2 +
                            (((long)iVar1 - (long)local_418.begin.z) * local_418.kstride -
                            (long)local_418.begin.x));
                local_588 = (double *)(local_418.jstride * 4);
                local_580 = (undefined **)-(long)local_418.begin.y;
                uVar5 = local_5e4.smallend.vect[1];
                iVar22 = iVar4;
                iVar20 = iVar3;
                iVar12 = local_5e4.smallend.vect[1] * 2;
                do {
                  if (local_5e4.smallend.vect[0] <= local_5e4.bigend.vect[0]) {
                    lVar28 = (~local_458.begin.z + iVar17) * local_458.kstride;
                    lVar29 = (iVar10 - local_458.begin.z) * local_458.kstride;
                    lVar37 = (iVar17 - local_458.begin.z) * local_458.kstride;
                    lVar26 = local_458.kstride * 8;
                    lVar31 = ((long)iVar1 - (long)local_458.begin.z) * lVar26;
                    lVar36 = (local_5c8._0_4_ - local_458.begin.z) * lVar26;
                    lVar26 = (iVar11 - local_458.begin.z) * lVar26;
                    lVar13 = (int)(~local_458.begin.y + uVar5 * 2) * local_458.jstride;
                    lVar14 = (int)((uVar5 * 2 + 1) - local_458.begin.y) * local_458.jstride;
                    lVar16 = (int)(uVar5 * 2 - local_458.begin.y) * local_458.jstride;
                    lVar27 = local_458.jstride * 8;
                    lVar39 = ((long)iVar12 - (long)local_458.begin.y) * lVar27;
                    lVar25 = (iVar20 - local_458.begin.y) * lVar27;
                    lVar27 = (iVar22 - local_458.begin.y) * lVar27;
                    lVar15 = (long)local_458.begin.x;
                    ppuVar23 = (undefined **)(local_458.p + lVar32 * 2);
                    lVar21 = 0;
                    iVar30 = iVar8;
                    do {
                      dVar52 = 0.0;
                      if (*(int *)((long)local_590 +
                                  lVar21 * 4 + ((long)local_580 + (long)iVar12) * (long)local_588)
                          == 0) {
                        lVar19 = (long)((iVar9 - local_458.begin.x) + (int)lVar21);
                        lVar24 = (long)((local_5e4.smallend.vect[0] * 2 - local_458.begin.x) + 1 +
                                       (int)lVar21);
                        dVar52 = *(double *)
                                  ((long)ppuVar23 + lVar21 * 8 + lVar31 + lVar39 + lVar15 * -8) *
                                 0.125 + ((double)local_458.p[lVar16 + lVar19 + lVar37] +
                                          (double)local_458.p[lVar16 + lVar24 + lVar37] +
                                          *(double *)
                                           ((long)ppuVar23 +
                                           lVar21 * 8 + lVar31 + lVar27 + lVar15 * -8) +
                                          *(double *)
                                           ((long)ppuVar23 +
                                           lVar21 * 8 + lVar31 + lVar25 + lVar15 * -8) +
                                          *(double *)
                                           ((long)ppuVar23 +
                                           lVar21 * 8 + lVar39 + lVar26 + lVar15 * -8) +
                                         *(double *)
                                          ((long)ppuVar23 +
                                          lVar21 * 8 + lVar39 + lVar36 + lVar15 * -8)) * 0.0625 +
                                         ((double)local_458.p[lVar13 + lVar19 + lVar28] +
                                          (double)local_458.p[lVar13 + lVar24 + lVar28] +
                                          (double)local_458.p[lVar14 + lVar19 + lVar28] +
                                          (double)local_458.p[lVar14 + lVar24 + lVar28] +
                                          (double)local_458.p[lVar13 + lVar19 + lVar29] +
                                          (double)local_458.p[lVar13 + lVar24 + lVar29] +
                                          (double)local_458.p[lVar14 + lVar19 + lVar29] +
                                         (double)local_458.p[lVar14 + lVar24 + lVar29]) * 0.015625 +
                                         (*(double *)
                                           ((long)ppuVar23 +
                                           lVar21 * 8 + lVar27 + lVar26 + lVar15 * -8) +
                                          *(double *)
                                           ((long)ppuVar23 +
                                           lVar21 * 8 + lVar25 + lVar26 + lVar15 * -8) +
                                          *(double *)
                                           ((long)ppuVar23 +
                                           lVar21 * 8 + lVar36 + lVar27 + lVar15 * -8) +
                                          *(double *)
                                           ((long)ppuVar23 +
                                           lVar21 * 8 + lVar36 + lVar25 + lVar15 * -8) +
                                          (double)local_458.p[lVar16 + lVar19 + lVar28] +
                                          (double)local_458.p[lVar16 + lVar24 + lVar28] +
                                          (double)local_458.p[lVar16 + lVar19 + lVar29] +
                                          (double)local_458.p[lVar16 + lVar24 + lVar29] +
                                          (double)local_458.p[lVar13 + lVar19 + lVar37] +
                                          (double)local_458.p[lVar13 + lVar24 + lVar37] +
                                          (double)local_458.p[lVar14 + lVar19 + lVar37] +
                                         (double)local_458.p[lVar14 + lVar24 + lVar37]) * 0.03125;
                      }
                      *(double *)
                       (local_498._0_8_ +
                       lVar21 * 4 +
                       lVar32 * 8 +
                       (long)(int)local_478 * -8 +
                       ((long)(int)uVar7 - (long)local_470) * local_498._16_8_ * 8 +
                       ((long)(int)uVar5 - (long)local_478._4_4_) * local_498._8_8_ * 8) = dVar52;
                      lVar21 = lVar21 + 2;
                      iVar30 = iVar30 + -1;
                    } while (iVar30 != 0);
                  }
                  iVar12 = iVar12 + 2;
                  iVar20 = iVar20 + 2;
                  iVar22 = iVar22 + 2;
                  bVar42 = uVar5 != local_5e4.bigend.vect[1];
                  uVar5 = uVar5 + 1;
                } while (bVar42);
              }
              iVar1 = iVar1 + 2;
              local_5c8 = (double)CONCAT44(local_5c8._4_4_,local_5c8._0_4_ + 2);
              iVar11 = iVar11 + 2;
              bVar42 = uVar7 != local_5e4.bigend.vect[2];
              uVar7 = uVar7 + 1;
            } while (bVar42);
          }
        }
        else if (local_5e4.smallend.vect[2] <= local_5e4.bigend.vect[2]) {
          iVar1 = local_5e4.smallend.vect[0] * 2;
          uVar7 = local_5e4.smallend.vect[2];
          do {
            if (local_5e4.smallend.vect[1] <= local_5e4.bigend.vect[1]) {
              lVar32 = (long)(int)uVar7;
              iVar11 = (int)(lVar32 * 2);
              local_5c8 = (double)CONCAT44(local_5c8._4_4_,iVar11 + 1);
              uVar5 = local_5e4.smallend.vect[1];
              do {
                if (local_5e4.smallend.vect[0] <= local_5e4.bigend.vect[0]) {
                  lVar13 = (long)(int)uVar5;
                  iVar3 = (int)(lVar13 * 2);
                  lVar39 = (long)local_418.begin.y;
                  lVar21 = (long)local_418.begin.z;
                  lVar36 = (~local_458.begin.y + iVar3) * local_458.jstride;
                  lVar25 = (iVar3 - local_458.begin.y) * local_458.jstride;
                  lVar16 = ((iVar3 + 1) - local_458.begin.y) * local_458.jstride;
                  lVar26 = (lVar13 - local_458.begin.y) * local_458.jstride;
                  lVar31 = (~local_458.begin.z + iVar11) * local_458.kstride;
                  lVar14 = (iVar11 - local_458.begin.z) * local_458.kstride;
                  lVar15 = ((iVar11 + 1) - local_458.begin.z) * local_458.kstride;
                  uVar33 = ~local_458.begin.x;
                  lVar27 = (lVar32 - local_458.begin.z) * local_458.kstride;
                  iVar4 = -local_418.begin.x;
                  iVar17 = -local_458.begin.x;
                  iVar8 = iVar4;
                  iVar9 = iVar17;
                  uVar34 = uVar33;
                  iVar12 = iVar17;
                  iVar20 = local_5e4.smallend.vect[0];
                  iVar22 = iVar4;
                  do {
                    if (cVar38 == '\0') {
                      dVar52 = 0.0;
                      if (local_418.p
                          [(lVar13 * 2 - lVar39) * local_418.jstride +
                           (lVar32 * 2 - lVar21) * local_418.kstride + (long)(iVar4 + iVar20)] == 0)
                      {
                        lVar37 = (long)(iVar17 + iVar20);
                        dVar52 = local_458.p[lVar25 + lVar37 + lVar15] +
                                 (double)local_458.p[lVar25 + lVar37 + lVar15] +
                                 local_458.p[lVar16 + lVar37 + lVar14] +
                                 (double)local_458.p[lVar16 + lVar37 + lVar14] +
                                 (double)local_458.p[lVar25 + lVar37 + lVar14] * 4.0 +
                                 local_458.p[lVar36 + lVar37 + lVar14] +
                                 (double)local_458.p[lVar36 + lVar37 + lVar14] +
                                 local_458.p[lVar25 + lVar37 + lVar31] +
                                 (double)local_458.p[lVar25 + lVar37 + lVar31] +
                                 (double)local_458.p[lVar36 + lVar37 + lVar31] +
                                 (double)local_458.p[lVar16 + lVar37 + lVar31] +
                                 (double)local_458.p[lVar36 + lVar37 + lVar15] +
                                 (double)local_458.p[lVar16 + lVar37 + lVar15];
                        goto LAB_0059c17d;
                      }
                    }
                    else if (cVar38 == '\x01') {
                      dVar52 = 0.0;
                      if (local_418.p
                          [(lVar13 - lVar39) * local_418.jstride +
                           (iVar11 - lVar21) * local_418.kstride + (long)(iVar1 + iVar8)] == 0) {
                        lVar37 = (long)(int)(iVar1 + uVar34);
                        lVar28 = (long)(iVar1 + iVar9);
                        lVar29 = (long)(iVar1 + 1 + iVar9);
                        dVar52 = local_458.p[lVar26 + lVar28 + lVar15] +
                                 (double)local_458.p[lVar26 + lVar28 + lVar15] +
                                 local_458.p[lVar26 + lVar29 + lVar14] +
                                 (double)local_458.p[lVar26 + lVar29 + lVar14] +
                                 (double)local_458.p[lVar26 + lVar28 + lVar14] * 4.0 +
                                 local_458.p[lVar26 + lVar37 + lVar14] +
                                 (double)local_458.p[lVar26 + lVar37 + lVar14] +
                                 local_458.p[lVar26 + lVar28 + lVar31] +
                                 (double)local_458.p[lVar26 + lVar28 + lVar31] +
                                 (double)local_458.p[lVar26 + lVar37 + lVar31] +
                                 (double)local_458.p[lVar26 + lVar29 + lVar31] +
                                 (double)local_458.p[lVar26 + lVar37 + lVar15] +
                                 (double)local_458.p[lVar26 + lVar29 + lVar15];
LAB_0059c17d:
                        dVar52 = dVar52 * 0.0625;
                      }
                    }
                    else {
                      dVar52 = 0.0;
                      if (local_418.p
                          [(iVar3 - lVar39) * local_418.jstride +
                           (lVar32 - lVar21) * local_418.kstride + (long)(iVar1 + iVar22)] == 0) {
                        lVar37 = (long)(int)(iVar1 + uVar33);
                        lVar28 = (long)(iVar1 + iVar12);
                        lVar29 = (long)(iVar1 + 1 + iVar12);
                        dVar52 = local_458.p[lVar16 + lVar27 + lVar28] +
                                 (double)local_458.p[lVar16 + lVar27 + lVar28] +
                                 local_458.p[lVar25 + lVar27 + lVar29] +
                                 (double)local_458.p[lVar25 + lVar27 + lVar29] +
                                 (double)local_458.p[lVar25 + lVar27 + lVar28] * 4.0 +
                                 local_458.p[lVar25 + lVar27 + lVar37] +
                                 (double)local_458.p[lVar25 + lVar27 + lVar37] +
                                 local_458.p[lVar36 + lVar27 + lVar28] +
                                 (double)local_458.p[lVar36 + lVar27 + lVar28] +
                                 (double)local_458.p[lVar36 + lVar27 + lVar37] +
                                 (double)local_458.p[lVar36 + lVar27 + lVar29] +
                                 (double)local_458.p[lVar16 + lVar27 + lVar37] +
                                 (double)local_458.p[lVar16 + lVar27 + lVar29];
                        goto LAB_0059c17d;
                      }
                    }
                    *(double *)
                     (local_498._0_8_ +
                     ((lVar13 - local_478._4_4_) * local_498._8_8_ +
                     (long)(iVar20 - (int)local_478) + (lVar32 - local_470) * local_498._16_8_) * 8)
                         = dVar52;
                    iVar20 = iVar20 + 1;
                    iVar12 = iVar12 + 2;
                    uVar33 = uVar33 + 2;
                    iVar22 = iVar22 + 2;
                    iVar9 = iVar9 + 2;
                    uVar34 = uVar34 + 2;
                    iVar8 = iVar8 + 2;
                  } while (local_5e4.bigend.vect[0] + 1U != iVar20);
                }
                bVar42 = uVar5 != local_5e4.bigend.vect[1];
                uVar5 = uVar5 + 1;
              } while (bVar42);
            }
            bVar42 = uVar7 != local_5e4.bigend.vect[2];
            uVar7 = uVar7 + 1;
          } while (bVar42);
        }
      }
      else {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_258,*(FabArray<amrex::FArrayBox> **)(local_380 + local_578 * 8),
                   (MFIter *)&local_218);
        local_51c = local_5e4.bigend.vect[2];
        local_568 = (ulong)(uint)local_5e4.smallend.vect[2];
        if (local_5e4.smallend.vect[2] <= local_5e4.bigend.vect[2]) {
          local_348 = (ulong)(uint)local_5e4.bigend.vect[0];
          local_4c0 = (long)local_5e4.smallend.vect[0];
          local_50c = local_5e4.bigend.vect[0] + 1;
          do {
            if (local_5e4.smallend.vect[1] <= local_5e4.bigend.vect[1]) {
              local_350 = (long)(int)(uint)local_568;
              local_358 = local_350 * 2;
              iVar1 = (int)local_358;
              local_510 = iVar1 + -2;
              local_514 = iVar1 + -1;
              local_518 = iVar1 + 1;
              local_4a8 = (long)local_418.begin.x;
              local_360 = (long)local_418.begin.y;
              local_368 = local_418.jstride;
              local_370 = local_418.p + (local_358 - local_418.begin.z) * local_418.kstride;
              local_560 = (ulong)(uint)local_5e4.smallend.vect[1];
              do {
                if (local_5e4.smallend.vect[0] <= local_5e4.bigend.vect[0]) {
                  lVar32 = (long)(int)(uint)local_560 * 2;
                  iVar11 = (int)lVar32;
                  local_4a0 = (double *)
                              (local_498._0_8_ +
                              (((long)(int)(uint)local_560 - (long)local_478._4_4_) *
                               local_498._8_8_ + (local_350 - local_470) * local_498._16_8_) * 8);
                  local_580 = (undefined **)
                              (local_458.p + (iVar11 - local_458.begin.y) * local_458.jstride);
                  lVar31 = local_258.jstride * (iVar11 - local_258.begin.y);
                  local_588 = local_258.p + ((iVar11 - local_258.begin.y) + -2) * local_258.jstride;
                  local_590 = local_258.p + ((iVar11 + -1) - local_258.begin.y) * local_258.jstride;
                  local_598 = local_258.p + ((iVar11 + 1) - local_258.begin.y) * local_258.jstride;
                  local_5a0 = (undefined **)
                              (local_458.p + ((iVar11 + -1) - local_458.begin.y) * local_458.jstride
                              );
                  local_5a8 = (undefined **)
                              (local_458.p + ((iVar11 + 1) - local_458.begin.y) * local_458.jstride)
                  ;
                  lVar36 = (iVar1 - local_258.begin.z) * local_258.kstride;
                  lVar14 = (local_510 - local_258.begin.z) * local_258.kstride;
                  lVar15 = (local_514 - local_258.begin.z) * local_258.kstride;
                  lVar16 = (local_518 - local_258.begin.z) * local_258.kstride;
                  local_5b0 = (iVar1 - local_458.begin.z) * local_458.kstride;
                  lVar25 = (local_514 - local_458.begin.z) * local_458.kstride;
                  lVar26 = (local_518 - local_458.begin.z) * local_458.kstride;
                  local_320 = local_370 + (lVar32 - local_360) * local_418.jstride;
                  local_328 = local_258.nstride * 8;
                  local_340 = local_258.nstride * 7;
                  lVar13 = (long)local_458.begin.x;
                  local_330 = (long)local_258.begin.x;
                  local_4b0 = local_5a0 + local_5b0;
                  local_4b8 = local_5a8 + local_5b0;
                  local_338 = (long)(int)local_478;
                  lVar32 = local_4c0;
                  do {
                    uVar18 = lVar32 * 2;
                    dVar52 = 0.0;
                    if (local_320[uVar18 - local_4a8] == 0) {
                      lVar37 = uVar18 - lVar13;
                      lVar21 = (long)(((int)uVar18 - local_258.begin.x) + -2);
                      lVar39 = uVar18 - 1;
                      lVar27 = lVar39 - local_330;
                      dVar52 = local_258.p[lVar31 + lVar27 + lVar36 + local_258.nstride];
                      if (((local_258.p[lVar31 + lVar21 + lVar36 + local_258.nstride] != 0.0) ||
                          (dVar52 != 0.0)) || (NAN(dVar52))) {
                        dVar52 = ((double)local_580[local_5b0 + (lVar39 - lVar13)] * ABS(dVar52)) /
                                 (ABS(local_258.p[lVar31 + lVar21 + lVar36 + local_258.nstride]) +
                                 ABS(dVar52));
                      }
                      else {
                        dVar52 = (double)local_580[local_5b0 + (lVar39 - lVar13)] * 0.5;
                      }
                      lVar28 = uVar18 - local_330;
                      uVar18 = uVar18 | 1;
                      dVar53 = local_258.p[lVar31 + lVar28 + lVar36 + local_258.nstride];
                      dVar54 = (local_258.p + lVar31 + lVar28 + lVar36 + local_258.nstride)[1];
                      if (((dVar53 != 0.0) || (NAN(dVar53))) || ((dVar54 != 0.0 || (NAN(dVar54)))))
                      {
                        dVar53 = ((double)local_580[local_5b0 + (uVar18 - lVar13)] * ABS(dVar53)) /
                                 (ABS(dVar54) + ABS(dVar53));
                      }
                      else {
                        dVar53 = (double)local_580[local_5b0 + (uVar18 - lVar13)] * 0.5;
                      }
                      local_2d8 = local_588 + lVar28;
                      dVar54 = local_2d8[lVar36 + local_258.nstride * 2];
                      dVar55 = local_590[lVar28 + lVar36 + local_258.nstride * 2];
                      if (((dVar54 != 0.0) || (NAN(dVar54))) || ((dVar55 != 0.0 || (NAN(dVar55)))))
                      {
                        dVar54 = ((double)local_4b0[lVar37] * ABS(dVar55)) /
                                 (ABS(dVar54) + ABS(dVar55));
                      }
                      else {
                        dVar54 = (double)local_4b0[lVar37] * 0.5;
                      }
                      dVar55 = local_258.p[lVar31 + lVar28 + lVar36 + local_258.nstride * 2];
                      local_2e8 = local_598 + lVar28;
                      dVar56 = local_2e8[lVar36 + local_258.nstride * 2];
                      if ((((dVar55 != 0.0) || (NAN(dVar55))) || (dVar56 != 0.0)) || (NAN(dVar56)))
                      {
                        dVar55 = ((double)local_4b8[lVar37] * ABS(dVar55)) /
                                 (ABS(dVar55) + ABS(dVar56));
                      }
                      else {
                        dVar55 = (double)local_4b8[lVar37] * 0.5;
                      }
                      dVar56 = local_258.p[lVar31 + lVar28 + lVar14 + local_258.nstride * 3];
                      dVar57 = local_258.p[lVar31 + lVar28 + lVar15 + local_258.nstride * 3];
                      if (((dVar56 != 0.0) || (NAN(dVar56))) || ((dVar57 != 0.0 || (NAN(dVar57)))))
                      {
                        dVar56 = ((double)local_580[lVar37 + lVar25] * ABS(dVar57)) /
                                 (ABS(dVar56) + ABS(dVar57));
                      }
                      else {
                        dVar56 = (double)local_580[lVar37 + lVar25] * 0.5;
                      }
                      lVar29 = uVar18 - local_330;
                      dVar57 = local_258.p[lVar31 + lVar28 + lVar36 + local_258.nstride * 3];
                      local_2e0 = local_258.p + lVar31 + lVar28 + lVar16;
                      dVar43 = local_2e0[local_258.nstride * 3];
                      if (((dVar57 != 0.0) || (NAN(dVar57))) || ((dVar43 != 0.0 || (NAN(dVar43)))))
                      {
                        dVar57 = ((double)local_580[lVar37 + lVar26] * ABS(dVar57)) /
                                 (ABS(dVar57) + ABS(dVar43));
                      }
                      else {
                        dVar57 = (double)local_580[lVar37 + lVar26] * 0.5;
                      }
                      local_298 = local_590 + lVar21 + lVar36;
                      local_530 = local_588 + lVar21;
                      local_288 = local_530 + lVar36;
                      dVar90 = ABS(local_288[local_258.nstride * 4]);
                      dVar58 = ABS(local_298[local_258.nstride * 4]);
                      local_2a0 = local_590 + lVar27 + lVar36;
                      local_290 = local_588 + lVar27 + lVar36;
                      dVar114 = ABS(local_290[local_258.nstride * 4]);
                      dVar98 = ABS(local_2a0[local_258.nstride * 4]);
                      dVar126 = ABS(local_290[local_258.nstride * 2]) / (dVar90 + dVar114 + 1e-100);
                      dVar135 = ABS(local_2a0[local_258.nstride * 2]) / (dVar58 + dVar98 + 1e-100);
                      dVar66 = ABS(local_298[local_258.nstride]) / (dVar90 + dVar58 + 1e-100) + 1.0;
                      dVar84 = ABS(local_2a0[local_258.nstride]) / (dVar114 + dVar98 + 1e-100) + 1.0
                      ;
                      dVar98 = (dVar84 + dVar135) * dVar98;
                      lVar39 = lVar39 - lVar13;
                      local_538 = local_5a0 + lVar39;
                      dVar91 = ABS(local_2d8[lVar36 + local_258.nstride * 4]);
                      dVar43 = ABS(local_590[lVar28 + lVar36 + local_258.nstride * 4]);
                      local_2d0 = local_590 + lVar29 + lVar36;
                      local_268 = local_588 + lVar29;
                      local_2c8 = local_268 + lVar36;
                      dVar127 = ABS(local_2c8[local_258.nstride * 4]);
                      dVar99 = ABS(local_2d0[local_258.nstride * 4]);
                      dVar115 = ABS(local_2c8[local_258.nstride * 2]) / (dVar91 + dVar127 + 1e-100);
                      dVar136 = ABS(local_2d0[local_258.nstride * 2]) / (dVar43 + dVar99 + 1e-100);
                      dVar67 = ABS(local_590[lVar28 + lVar36 + local_258.nstride]) /
                               (dVar91 + dVar43 + 1e-100) + 1.0;
                      dVar85 = ABS(local_2d0[local_258.nstride]) / (dVar127 + dVar99 + 1e-100) + 1.0
                      ;
                      dVar43 = (dVar67 + dVar136) * dVar43;
                      lVar19 = uVar18 - lVar13;
                      local_540 = local_5a0 + lVar19;
                      local_278 = local_598 + lVar21;
                      local_2f8 = local_278 + lVar36;
                      dVar100 = ABS(local_258.p[lVar31 + lVar21 + lVar36 + local_258.nstride * 4]);
                      dVar92 = ABS(local_2f8[local_258.nstride * 4]);
                      local_2f0 = local_598 + lVar27 + lVar36;
                      dVar128 = ABS(local_258.p[lVar31 + lVar27 + lVar36 + local_258.nstride * 4]);
                      dVar116 = ABS(local_2f0[local_258.nstride * 4]);
                      dVar59 = ABS(local_258.p[lVar31 + lVar27 + lVar36 + local_258.nstride * 2]) /
                               (dVar100 + dVar128 + 1e-100);
                      dVar137 = ABS(local_2f0[local_258.nstride * 2]) / (dVar92 + dVar116 + 1e-100);
                      dVar68 = ABS(local_2f8[local_258.nstride]) / (dVar100 + dVar92 + 1e-100) + 1.0
                      ;
                      dVar86 = ABS(local_2f0[local_258.nstride]) / (dVar128 + dVar116 + 1e-100) +
                               1.0;
                      dVar128 = (dVar59 + dVar86) * dVar128;
                      local_260 = local_5a8 + lVar39;
                      dVar44 = ABS(local_2e8[lVar36 + local_258.nstride * 4]);
                      dVar101 = ABS(local_258.p[lVar31 + lVar28 + lVar36 + local_258.nstride * 4]);
                      local_280 = local_598 + lVar29;
                      local_300 = local_280 + lVar36;
                      dVar117 = ABS(local_300[local_258.nstride * 4]);
                      dVar129 = ABS(local_258.p[lVar31 + lVar29 + lVar36 + local_258.nstride * 4]);
                      dVar93 = ABS(local_258.p[lVar31 + lVar29 + lVar36 + local_258.nstride * 2]) /
                               (dVar101 + dVar129 + 1e-100);
                      dVar138 = ABS(local_300[local_258.nstride * 2]) / (dVar44 + dVar117 + 1e-100);
                      dVar69 = ABS(local_2e8[lVar36 + local_258.nstride]) /
                               (dVar44 + dVar101 + 1e-100) + 1.0;
                      dVar101 = (dVar69 + dVar93) * dVar101;
                      dVar87 = ABS(local_300[local_258.nstride]) / (dVar117 + dVar129 + 1e-100) +
                               1.0;
                      local_270 = local_5a8 + lVar19;
                      local_2b8 = local_258.p + lVar31 + lVar21 + lVar15;
                      local_2a8 = local_258.p + lVar31 + lVar21 + lVar14;
                      dVar60 = ABS(local_2a8[local_258.nstride * 5]);
                      dVar70 = ABS(local_2b8[local_258.nstride * 5]);
                      uStack_4e0 = 0;
                      local_2b0 = local_258.p + lVar31 + lVar27 + lVar15;
                      local_2c0 = local_258.p + lVar31 + lVar27 + lVar14;
                      dVar181 = ABS(local_2c0[local_258.nstride * 5]);
                      dVar171 = ABS(local_2b0[local_258.nstride * 5]);
                      dVar189 = ABS(local_2c0[local_258.nstride * 3]) / (dVar60 + dVar181 + 1e-100);
                      dVar194 = ABS(local_2b0[local_258.nstride * 3]) / (dVar70 + dVar171 + 1e-100);
                      dVar88 = ABS(local_2b8[local_258.nstride]) / (dVar60 + dVar70 + 1e-100) + 1.0;
                      local_308 = local_258.p + lVar31 + lVar21 + lVar16;
                      dVar45 = ABS(local_308[local_258.nstride * 5]);
                      uStack_3a0 = 0;
                      dVar155 = ABS(local_258.p[lVar31 + lVar21 + lVar36 + local_258.nstride * 5]);
                      local_310 = local_258.p + lVar31 + lVar27 + lVar16;
                      dVar61 = ABS(local_310[local_258.nstride * 5]);
                      uStack_3b0 = 0;
                      dVar46 = ABS(local_258.p[lVar31 + lVar27 + lVar36 + local_258.nstride * 5]);
                      dVar62 = ABS(local_258.p[lVar31 + lVar27 + lVar36 + local_258.nstride * 3]) /
                               (dVar155 + dVar46 + 1e-100);
                      dVar94 = ABS(local_308[local_258.nstride]) / (dVar45 + dVar155 + 1e-100) + 1.0
                      ;
                      dVar71 = ABS(local_310[local_258.nstride]) / (dVar61 + dVar46 + 1e-100) + 1.0;
                      uStack_3d0 = 0;
                      dVar46 = (dVar62 + dVar71) * dVar46;
                      dVar148 = ABS(local_2b0[local_258.nstride]) / (dVar181 + dVar171 + 1e-100) +
                                1.0;
                      dVar171 = (dVar148 + dVar194) * dVar171;
                      dVar102 = ABS(local_258.p[lVar31 + lVar28 + lVar14 + local_258.nstride * 5]);
                      dVar47 = ABS(local_258.p[lVar31 + lVar28 + lVar15 + local_258.nstride * 5]);
                      local_548 = local_258.p + lVar31 + lVar29 + lVar15;
                      local_550 = local_258.p + lVar31 + lVar29 + lVar14;
                      dVar149 = ABS(local_550[local_258.nstride * 5]);
                      dVar72 = ABS(local_548[local_258.nstride * 5]);
                      uStack_3c0 = 0;
                      dVar195 = ABS(local_550[local_258.nstride * 3]) / (dVar102 + dVar149 + 1e-100)
                      ;
                      dVar73 = ABS(local_548[local_258.nstride * 3]) / (dVar47 + dVar72 + 1e-100);
                      dVar172 = ABS(local_258.p[lVar31 + lVar28 + lVar15 + local_258.nstride]) /
                                (dVar102 + dVar47 + 1e-100) + 1.0;
                      dVar182 = ABS(local_548[local_258.nstride]) / (dVar149 + dVar72 + 1e-100) +
                                1.0;
                      dVar47 = (dVar172 + dVar73) * dVar47;
                      dVar103 = ABS(local_310[local_258.nstride * 3]) / (dVar45 + dVar61 + 1e-100);
                      dVar95 = ABS(local_2e0[local_258.nstride * 5]);
                      dVar48 = ABS(local_258.p[lVar31 + lVar28 + lVar36 + local_258.nstride * 5]);
                      local_318 = local_258.p + lVar31 + lVar29 + lVar16;
                      dVar118 = ABS(local_318[local_258.nstride * 5]);
                      dVar139 = ABS(local_258.p[lVar31 + lVar29 + lVar36 + local_258.nstride * 5]);
                      dVar156 = ABS(local_258.p[lVar31 + lVar29 + lVar36 + local_258.nstride * 3]) /
                                (dVar48 + dVar139 + 1e-100);
                      dVar173 = ABS(local_318[local_258.nstride * 3]) / (dVar95 + dVar118 + 1e-100);
                      dVar74 = ABS(local_2e0[local_258.nstride]) / (dVar95 + dVar48 + 1e-100) + 1.0;
                      dVar48 = (dVar74 + dVar156) * dVar48;
                      dVar104 = ABS(local_318[local_258.nstride]) / (dVar118 + dVar139 + 1e-100) +
                                1.0;
                      local_3a8 = local_2d8 + lVar15;
                      dVar157 = ABS(local_3a8[local_258.nstride * 6]);
                      local_3c8 = local_2e8 + lVar15;
                      dVar75 = ABS(local_3c8[local_258.nstride * 6]);
                      local_558 = local_2d8 + lVar14;
                      dVar105 = ABS(local_558[local_258.nstride * 6]);
                      dVar113 = ABS(local_258.p[lVar31 + lVar28 + lVar14 + local_258.nstride * 6]);
                      dVar49 = ABS(local_3a8[local_258.nstride * 2]) / (dVar105 + dVar157 + 1e-100)
                               + 1.0;
                      local_4e8 = local_590 + lVar28 + lVar15;
                      dVar119 = ABS(local_4e8[local_258.nstride * 6]);
                      dVar125 = ABS(local_258.p[lVar31 + lVar28 + lVar15 + local_258.nstride * 6]);
                      auVar164._0_8_ = ABS(local_4e8[local_258.nstride * 3]);
                      auVar164._8_8_ = ABS(local_3c8[local_258.nstride * 3]);
                      auVar176._0_8_ = dVar119 + dVar157 + 1e-100;
                      auVar176._8_8_ = dVar75 + dVar125 + 1e-100;
                      auVar96 = divpd(auVar164,auVar176);
                      auVar159._0_8_ = ABS(local_4e8[local_258.nstride * 2]);
                      auVar159._8_8_ =
                           ABS(local_258.p[lVar31 + lVar28 + lVar15 + local_258.nstride * 2]);
                      local_3b8 = local_590 + lVar28 + lVar14;
                      local_3d8 = local_2e8 + lVar14;
                      dVar174 = ABS(local_3b8[local_258.nstride * 6]);
                      dVar180 = ABS(local_3d8[local_258.nstride * 6]);
                      auVar190._0_8_ = dVar174 + dVar119 + 1e-100;
                      auVar190._8_8_ = dVar125 + dVar113 + 1e-100;
                      auVar160 = divpd(auVar159,auVar190);
                      auVar183._0_8_ = ABS(local_3b8[local_258.nstride * 3]);
                      auVar183._8_8_ = ABS(local_3d8[local_258.nstride * 3]);
                      auVar191._0_8_ = dVar105 + dVar174 + 1e-100;
                      auVar191._8_8_ = dVar113 + dVar180 + 1e-100;
                      auVar184 = divpd(auVar183,auVar191);
                      dVar158 = auVar160._0_8_ + 1.0;
                      dVar170 = auVar160._8_8_ + 1.0;
                      dVar63 = ABS(local_3c8[local_258.nstride * 2]) / (dVar180 + dVar75 + 1e-100) +
                               1.0;
                      dVar119 = (auVar96._0_8_ + dVar158) * dVar119;
                      dVar125 = (auVar96._8_8_ + dVar170) * dVar125;
                      auVar160._0_8_ = (double)local_5a0[lVar37 + lVar25] * dVar119;
                      auVar160._8_8_ = (double)local_5a8[lVar37 + lVar25] * dVar125;
                      auVar166._0_8_ =
                           dVar119 + (dVar49 + auVar96._0_8_) * dVar157 +
                                     (dVar158 + auVar184._0_8_) * dVar174 +
                                     (dVar49 + auVar184._0_8_) * dVar105 + 1e-100;
                      auVar166._8_8_ =
                           (auVar96._8_8_ + dVar63) * dVar75 +
                           dVar125 + (dVar63 + auVar184._8_8_) * dVar180 +
                                     (dVar170 + auVar184._8_8_) * dVar113 + 1e-100;
                      auVar160 = divpd(auVar160,auVar166);
                      dVar49 = ABS(local_2d8[lVar36 + local_258.nstride * 6]);
                      dVar113 = ABS(local_2e8[lVar36 + local_258.nstride * 6]);
                      dVar105 = ABS(local_2d8[lVar16 + local_258.nstride * 6]);
                      dVar119 = ABS(local_2e0[local_258.nstride * 6]);
                      dVar180 = ABS(local_2d8[lVar16 + local_258.nstride * 2]) /
                                (dVar105 + dVar49 + 1e-100) + 1.0;
                      dVar63 = ABS(local_590[lVar28 + lVar36 + local_258.nstride * 6]);
                      dVar75 = ABS(local_258.p[lVar31 + lVar28 + lVar36 + local_258.nstride * 6]);
                      auVar161._0_8_ = ABS(local_590[lVar28 + lVar36 + local_258.nstride * 3]);
                      auVar161._8_8_ = ABS(local_2e8[lVar36 + local_258.nstride * 3]);
                      auVar186._0_8_ = dVar63 + dVar49 + 1e-100;
                      auVar186._8_8_ = dVar113 + dVar75 + 1e-100;
                      auVar162 = divpd(auVar161,auVar186);
                      auVar123._0_8_ = ABS(local_590[lVar28 + lVar16 + local_258.nstride * 2]);
                      auVar123._8_8_ = ABS(local_2e0[local_258.nstride * 2]);
                      dVar158 = ABS(local_590[lVar28 + lVar16 + local_258.nstride * 6]);
                      dVar170 = ABS(local_2e8[lVar16 + local_258.nstride * 6]);
                      auVar89._0_8_ = dVar158 + dVar63 + 1e-100;
                      auVar89._8_8_ = dVar75 + dVar119 + 1e-100;
                      auVar184 = divpd(auVar123,auVar89);
                      local_398 = local_2e8[lVar16 + local_258.nstride * 7];
                      uStack_390 = 0;
                      auVar110._0_8_ = ABS(local_590[lVar28 + lVar16 + local_258.nstride * 3]);
                      auVar110._8_8_ = ABS(local_2e8[lVar16 + local_258.nstride * 3]);
                      auVar177._0_8_ = dVar105 + dVar158 + 1e-100;
                      auVar177._8_8_ = dVar170 + dVar119 + 1e-100;
                      auVar96 = divpd(auVar110,auVar177);
                      dVar125 = auVar184._0_8_ + 1.0;
                      dVar157 = auVar184._8_8_ + 1.0;
                      dVar63 = (auVar162._0_8_ + dVar125) * dVar63;
                      dVar75 = (auVar162._8_8_ + dVar157) * dVar75;
                      dVar174 = ABS(local_2e8[lVar16 + local_258.nstride * 2]) /
                                (dVar170 + dVar113 + 1e-100) + 1.0;
                      local_4f8 = local_2f8[local_258.nstride * 7];
                      uStack_4f0 = 0;
                      auVar184._0_8_ =
                           dVar63 + (dVar180 + auVar162._0_8_) * dVar49 +
                           (dVar180 + auVar96._0_8_) * dVar105 + (dVar125 + auVar96._0_8_) * dVar158
                           + 1e-100;
                      auVar184._8_8_ =
                           (auVar162._8_8_ + dVar174) * dVar113 + dVar75 +
                           (dVar157 + auVar96._8_8_) * dVar119 + (dVar174 + auVar96._8_8_) * dVar170
                           + 1e-100;
                      auVar151._8_8_ = (double)local_5a8[lVar37 + lVar26] * dVar75;
                      auVar151._0_8_ = (double)local_5a0[lVar37 + lVar26] * dVar63;
                      auVar89 = divpd(auVar151,auVar184);
                      dVar157 = ABS(local_258.p[lVar31 + lVar28 + lVar36 + local_258.nstride * 7]);
                      dVar140 = ABS(local_2e0[local_258.nstride * 7]);
                      auVar162._8_4_ = SUB84(dVar157,0);
                      auVar162._0_8_ = dVar157;
                      auVar162._12_4_ = (int)((ulong)dVar157 >> 0x20);
                      dVar49 = dVar157 + ABS(local_258.p
                                             [lVar31 + lVar29 + lVar36 + local_258.nstride * 7]);
                      dVar75 = auVar162._8_8_ + ABS(local_2e8[lVar36 + local_258.nstride * 7]);
                      local_508 = local_310[local_258.nstride * 4];
                      uStack_500 = 0;
                      auVar163._0_8_ =
                           ABS(local_258.p[lVar31 + lVar29 + lVar36 + local_258.nstride * 6]);
                      auVar163._8_8_ = ABS(local_2e8[lVar36 + local_258.nstride * 5]);
                      auVar65._0_8_ = dVar49 + 1e-100;
                      auVar65._8_8_ = dVar75 + 1e-100;
                      auVar164 = divpd(auVar163,auVar65);
                      dVar180 = ABS(local_258.p[lVar31 + lVar27 + lVar36 + local_258.nstride * 7]);
                      dVar158 = ABS(local_310[local_258.nstride * 7]);
                      auVar132._8_4_ = SUB84(dVar180,0);
                      auVar132._0_8_ = dVar180;
                      auVar132._12_4_ = (int)((ulong)dVar180 >> 0x20);
                      dVar105 = dVar180 + ABS(local_258.p
                                              [lVar31 + lVar21 + lVar36 + local_258.nstride * 7]);
                      dVar119 = auVar132._8_8_ + ABS(local_2f0[local_258.nstride * 7]);
                      local_5c8 = local_588[lVar27 + lVar16 + local_258.nstride * 7];
                      uStack_5c0 = 0;
                      auVar150._0_8_ =
                           ABS(local_258.p[lVar31 + lVar27 + lVar36 + local_258.nstride * 6]);
                      auVar150._8_8_ = ABS(local_2f0[local_258.nstride * 5]);
                      auVar134._0_8_ = dVar105 + 1e-100;
                      auVar134._8_8_ = dVar119 + 1e-100;
                      auVar151 = divpd(auVar150,auVar134);
                      dVar175 = ABS(local_590[lVar28 + lVar36 + local_258.nstride * 7]);
                      dVar141 = ABS(local_590[lVar28 + lVar16 + local_258.nstride * 7]);
                      dVar170 = ABS(local_2d0[local_258.nstride * 7]) + dVar175;
                      dVar174 = dVar175 + ABS(local_2d8[lVar36 + local_258.nstride * 7]);
                      auVar131._0_8_ = ABS(local_590[lVar28 + lVar16 + local_258.nstride * 4]);
                      auVar131._8_8_ = ABS(local_2d0[local_258.nstride * 3]);
                      auVar107._0_8_ = dVar175 + dVar141 + 1e-100;
                      auVar107._8_8_ =
                           ABS(local_2d8[lVar36 + local_258.nstride * 7]) +
                           ABS(local_2c8[local_258.nstride * 7]) + dVar175 +
                           ABS(local_2d0[local_258.nstride * 7]) + 1e-100;
                      auVar132 = divpd(auVar131,auVar107);
                      auVar165._0_8_ = ABS(local_2d0[local_258.nstride * 6]);
                      auVar165._8_8_ = ABS(local_590[lVar28 + lVar36 + local_258.nstride * 5]);
                      auVar153._0_8_ = dVar170 + 1e-100;
                      auVar153._8_8_ = dVar174 + 1e-100;
                      auVar166 = divpd(auVar165,auVar153);
                      dVar113 = ABS(local_2a0[local_258.nstride * 7]);
                      dVar196 = ABS(local_298[local_258.nstride * 7]) + dVar113;
                      dVar197 = dVar113 + ABS(local_290[local_258.nstride * 7]);
                      dVar106 = ABS(local_590[lVar27 + lVar16 + local_258.nstride * 7]);
                      auVar81._8_4_ = SUB84(dVar113,0);
                      auVar81._0_8_ = dVar113;
                      auVar81._12_4_ = (int)((ulong)dVar113 >> 0x20);
                      auVar185._0_8_ = ABS(local_590[lVar27 + lVar16 + local_258.nstride * 4]);
                      auVar185._8_8_ = ABS(local_2a0[local_258.nstride * 3]);
                      auVar108._0_8_ = dVar106 + dVar113 + 1e-100;
                      auVar108._8_8_ =
                           ABS(local_290[local_258.nstride * 7]) +
                           ABS(local_288[local_258.nstride * 7]) +
                           ABS(local_298[local_258.nstride * 7]) + auVar81._8_8_ + 1e-100;
                      auVar186 = divpd(auVar185,auVar108);
                      auVar152._0_8_ = ABS(local_2a0[local_258.nstride * 6]);
                      auVar152._8_8_ = ABS(local_2a0[local_258.nstride * 5]);
                      auVar96._8_8_ = dVar197 + 1e-100;
                      auVar96._0_8_ = dVar196 + 1e-100;
                      auVar153 = divpd(auVar152,auVar96);
                      dVar142 = ABS(local_258.p[lVar31 + lVar28 + lVar14 + local_258.nstride * 7]);
                      dVar63 = ABS(local_3c8[local_258.nstride * 7]);
                      dVar120 = ABS(local_258.p[lVar31 + lVar28 + lVar15 + local_258.nstride * 7]);
                      auVar83._0_8_ = ABS(local_548[local_258.nstride * 2]);
                      auVar83._8_8_ = ABS(local_3c8[local_258.nstride]);
                      auVar187._8_4_ = SUB84(dVar142,0);
                      auVar187._0_8_ = dVar142;
                      auVar187._12_4_ = (int)((ulong)dVar142 >> 0x20);
                      auVar76._8_4_ = SUB84(dVar120,0);
                      auVar76._0_8_ = dVar120;
                      auVar76._12_4_ = (int)((ulong)dVar120 >> 0x20);
                      auVar188._0_8_ =
                           dVar142 + ABS(local_550[local_258.nstride * 7]) + dVar120 +
                           ABS(local_548[local_258.nstride * 7]) + 1e-100;
                      auVar188._8_8_ =
                           auVar187._8_8_ + ABS(local_3d8[local_258.nstride * 7]) + auVar76._8_8_ +
                           dVar63 + 1e-100;
                      auVar96 = divpd(auVar83,auVar188);
                      auVar133._0_8_ =
                           ABS(local_258.p[lVar31 + lVar28 + lVar15 + local_258.nstride * 4]);
                      auVar133._8_8_ = ABS(local_280[lVar15 + local_258.nstride * 3]);
                      dVar125 = dVar120 + ABS(local_548[local_258.nstride * 7]);
                      auVar143._0_8_ = dVar142 + dVar120 + 1e-100;
                      auVar143._8_8_ =
                           dVar63 + dVar125 + ABS(local_280[lVar15 + local_258.nstride * 7]) +
                           1e-100;
                      auVar134 = divpd(auVar133,auVar143);
                      auVar109._0_8_ = ABS(local_548[local_258.nstride * 6]);
                      auVar109._8_8_ = ABS(local_3c8[local_258.nstride * 5]);
                      auVar77._0_8_ = dVar125 + 1e-100;
                      auVar77._8_8_ = auVar76._8_8_ + dVar63 + 1e-100;
                      auVar110 = divpd(auVar109,auVar77);
                      dVar142 = ABS(local_2c0[local_258.nstride * 7]);
                      dVar130 = ABS(local_2b0[local_258.nstride * 7]);
                      dVar125 = ABS(local_598[lVar27 + lVar15 + local_258.nstride * 7]);
                      auVar145._8_4_ = SUB84(dVar142,0);
                      auVar145._0_8_ = dVar142;
                      auVar145._12_4_ = (int)((ulong)dVar142 >> 0x20);
                      auVar193._0_8_ = ABS(local_598[lVar27 + lVar15 + local_258.nstride]);
                      auVar193._8_8_ = ABS(local_2b0[local_258.nstride * 2]);
                      auVar169._0_8_ =
                           dVar125 + dVar130 + dVar142 + ABS(local_598[lVar27 + lVar14 + local_258.
                                                                                         nstride * 7
                                                                      ]) + 1e-100;
                      auVar169._8_8_ =
                           dVar130 + ABS(local_2b8[local_258.nstride * 7]) +
                                     auVar145._8_8_ + ABS(local_2a8[local_258.nstride * 7]) + 1e-100
                      ;
                      auVar162 = divpd(auVar193,auVar169);
                      auVar179._8_4_ = SUB84(dVar130,0);
                      auVar179._0_8_ = dVar130;
                      auVar179._12_4_ = (int)((ulong)dVar130 >> 0x20);
                      dVar63 = dVar130 + ABS(local_2b8[local_258.nstride * 7]);
                      auVar192._0_8_ = ABS(local_2b0[local_258.nstride * 4]);
                      auVar192._8_8_ = ABS(local_598[lVar27 + lVar15 + local_258.nstride * 3]);
                      auVar167._0_8_ = dVar130 + dVar142 + 1e-100;
                      auVar167._8_8_ =
                           ABS(local_278[lVar15 + local_258.nstride * 7]) + dVar63 + dVar125 +
                           1e-100;
                      auVar193 = divpd(auVar192,auVar167);
                      auVar144._0_8_ = ABS(local_2b0[local_258.nstride * 6]);
                      auVar144._8_8_ = ABS(local_598[lVar27 + lVar15 + local_258.nstride * 5]);
                      auVar50._0_8_ = dVar63 + 1e-100;
                      auVar50._8_8_ = auVar179._8_8_ + dVar125 + 1e-100;
                      auVar145 = divpd(auVar144,auVar50);
                      dVar121 = ABS(local_4e8[local_258.nstride * 7]);
                      dVar142 = ABS(local_3a8[local_258.nstride * 7]);
                      dVar63 = ABS(local_3b8[local_258.nstride * 7]);
                      dVar125 = ABS(local_590[lVar29 + lVar15 + local_258.nstride * 7]);
                      auVar146._8_4_ = SUB84(dVar63,0);
                      auVar146._0_8_ = dVar63;
                      auVar146._12_4_ = (int)((ulong)dVar63 >> 0x20);
                      auVar168._0_8_ = ABS(local_590[lVar29 + lVar15 + local_258.nstride * 2]);
                      auVar168._8_8_ = ABS(local_4e8[local_258.nstride]);
                      auVar147._0_8_ =
                           dVar63 + ABS(local_590[lVar29 + lVar14 + local_258.nstride * 7]) +
                           dVar121 + dVar125 + 1e-100;
                      auVar147._8_8_ =
                           auVar146._8_8_ + ABS(local_558[local_258.nstride * 7]) + dVar142 +
                           dVar121 + 1e-100;
                      auVar169 = divpd(auVar168,auVar147);
                      auVar64._0_8_ = ABS(local_4e8[local_258.nstride * 4]);
                      auVar64._8_8_ = ABS(local_590[lVar29 + lVar15 + local_258.nstride * 3]);
                      auVar154._0_8_ = dVar121 + dVar63 + 1e-100;
                      auVar154._8_8_ =
                           dVar142 + ABS(local_268[lVar15 + local_258.nstride * 7]) + dVar121 +
                           dVar125 + 1e-100;
                      auVar65 = divpd(auVar64,auVar154);
                      auVar178._0_8_ = ABS(local_590[lVar29 + lVar15 + local_258.nstride * 6]);
                      auVar178._8_8_ = ABS(local_4e8[local_258.nstride * 5]);
                      auVar111._0_8_ = dVar125 + dVar121 + 1e-100;
                      auVar111._8_8_ = dVar121 + dVar142 + 1e-100;
                      auVar179 = divpd(auVar178,auVar111);
                      dVar122 = ABS(local_590[lVar27 + lVar14 + local_258.nstride * 7]);
                      dVar142 = ABS(local_590[lVar21 + lVar15 + local_258.nstride * 7]);
                      dVar63 = ABS(local_590[lVar27 + lVar15 + local_258.nstride * 7]);
                      dVar125 = ABS(local_588[lVar27 + lVar15 + local_258.nstride * 7]);
                      auVar51._0_8_ = ABS(local_590[lVar27 + lVar15 + local_258.nstride]);
                      auVar51._8_8_ = ABS(local_590[lVar27 + lVar15 + local_258.nstride * 2]);
                      auVar78._8_4_ = SUB84(dVar122,0);
                      auVar78._0_8_ = dVar122;
                      auVar78._12_4_ = (int)((ulong)dVar122 >> 0x20);
                      auVar79._8_4_ = SUB84(dVar63,0);
                      auVar79._0_8_ = dVar63;
                      auVar79._12_4_ = (int)((ulong)dVar63 >> 0x20);
                      auVar97._0_8_ =
                           dVar125 + dVar122 + ABS(local_588[lVar27 + lVar14 + local_258.nstride * 7
                                                            ]) + dVar63 + 1e-100;
                      auVar97._8_8_ =
                           dVar142 + auVar78._8_8_ +
                                     ABS(local_590[lVar21 + lVar14 + local_258.nstride * 7]) +
                           auVar79._8_8_ + 1e-100;
                      auVar184 = divpd(auVar51,auVar97);
                      auVar80._0_8_ = ABS(local_590[lVar27 + lVar15 + local_258.nstride * 4]);
                      auVar80._8_8_ = ABS(local_590[lVar27 + lVar15 + local_258.nstride * 3]);
                      auVar124._0_8_ = dVar122 + dVar63 + 1e-100;
                      auVar124._8_8_ =
                           dVar125 + ABS(local_530[lVar15 + local_258.nstride * 7]) + dVar142 +
                           auVar79._8_8_ + 1e-100;
                      auVar81 = divpd(auVar80,auVar124);
                      auVar82._0_8_ = ABS(local_590[lVar27 + lVar15 + local_258.nstride * 6]);
                      auVar82._8_8_ = ABS(local_590[lVar27 + lVar15 + local_258.nstride * 5]);
                      auVar112._0_8_ = dVar142 + dVar63 + 1e-100;
                      auVar112._8_8_ = dVar63 + dVar125 + 1e-100;
                      auVar83 = divpd(auVar82,auVar112);
                      dVar52 = ((auVar83._8_8_ +
                                 auVar81._8_8_ + auVar184._8_8_ + auVar184._0_8_ + 1.0 +
                                 auVar81._0_8_ + auVar83._0_8_) * dVar63 * (double)local_538[lVar25]
                                * local_590[lVar27 + lVar15 + local_258.nstride * 8] +
                               (auVar179._8_8_ +
                                auVar65._8_8_ + auVar169._8_8_ + 1.0 + auVar169._0_8_ +
                                auVar65._0_8_ + auVar179._0_8_) * dVar121 *
                               (double)local_540[lVar25] *
                               local_590[lVar29 + lVar15 + local_258.nstride * 8] +
                               (auVar145._8_8_ +
                                auVar193._8_8_ + auVar162._8_8_ + auVar162._0_8_ + 1.0 +
                                auVar193._0_8_ + auVar145._0_8_) * dVar130 *
                               (double)local_260[lVar25] *
                               local_598[lVar27 + lVar15 + local_258.nstride * 8] +
                               (auVar110._8_8_ +
                                auVar134._8_8_ + auVar96._8_8_ + 1.0 + auVar96._0_8_ +
                                auVar134._0_8_ + auVar110._0_8_) * dVar120 *
                               (double)local_270[lVar25] * local_280[lVar15 + local_258.nstride * 8]
                               + (auVar153._8_8_ +
                                  auVar186._8_8_ +
                                  ABS(local_590[lVar27 + lVar16 + local_258.nstride * 2]) /
                                  (ABS(local_590[lVar21 + lVar16 + local_258.nstride * 7]) + dVar196
                                   + dVar106 + 1e-100) +
                                  ABS(local_590[lVar27 + lVar16 + local_258.nstride]) /
                                  (dVar197 + ABS(local_5c8) + dVar106 + 1e-100) + 1.0 +
                                  auVar186._0_8_ + auVar153._0_8_) * dVar113 *
                                 (double)local_538[lVar26] *
                                 local_590[lVar27 + lVar16 + local_258.nstride * 8] +
                                 (auVar166._8_8_ +
                                  auVar132._8_8_ +
                                  ABS(local_590[lVar29 + lVar16 + local_258.nstride * 2]) /
                                  (dVar141 + dVar170 +
                                   ABS(local_590[lVar29 + lVar16 + local_258.nstride * 7]) + 1e-100)
                                  + ABS(local_590[lVar28 + lVar16 + local_258.nstride]) /
                                    (dVar174 + ABS(local_2d8[lVar16 + local_258.nstride * 7]) +
                                     dVar141 + 1e-100) + 1.0 + auVar132._0_8_ + auVar166._0_8_) *
                                 dVar175 * (double)local_540[lVar26] *
                                 local_590[lVar29 + lVar16 + local_258.nstride * 8] +
                                 (auVar151._8_8_ +
                                  ABS(local_2f0[local_258.nstride * 3]) /
                                  (ABS(local_2f0[local_258.nstride * 7]) + ABS(local_4f8) + dVar105
                                  + 1e-100) +
                                  ABS(local_310[local_258.nstride * 2]) /
                                  (ABS(local_308[local_258.nstride * 7]) + dVar105 + dVar158 +
                                  1e-100) + ABS(local_598[lVar27 + lVar16 + local_258.nstride]) /
                                            (dVar119 + dVar158 +
                                             ABS(local_598[lVar27 + lVar16 + local_258.nstride * 7])
                                            + 1e-100) + 1.0 +
                                  ABS(local_508) / (dVar180 + dVar158 + 1e-100) + auVar151._0_8_) *
                                 dVar180 * (double)local_260[lVar26] *
                                 local_598[lVar27 + lVar16 + local_258.nstride * 8] +
                                 (auVar164._8_8_ +
                                  ABS(local_300[local_258.nstride * 3]) /
                                  (ABS(local_2e8[lVar36 + local_258.nstride * 7]) + dVar49 +
                                   ABS(local_300[local_258.nstride * 7]) + 1e-100) +
                                  ABS(local_318[local_258.nstride * 2]) /
                                  (dVar140 + dVar49 + ABS(local_318[local_258.nstride * 7]) + 1e-100
                                  ) + ABS(local_2e8[lVar16 + local_258.nstride]) /
                                      (dVar75 + dVar140 + ABS(local_398) + 1e-100) + 1.0 +
                                  ABS(local_2e0[local_258.nstride * 4]) /
                                  (dVar157 + dVar140 + 1e-100) + auVar164._0_8_) * dVar157 *
                                 (double)local_270[lVar26] *
                                 local_280[lVar16 + local_258.nstride * 8] +
                                 auVar89._8_8_ +
                                 auVar160._8_8_ +
                                 ((double)local_580[lVar19 + lVar26] * dVar48) /
                                 ((dVar156 + dVar104) * dVar139 + dVar48 +
                                  (dVar74 + dVar173) * dVar95 + (dVar104 + dVar173) * dVar118 +
                                 1e-100) + (dVar46 * (double)local_580[lVar39 + lVar26]) /
                                           ((dVar94 + dVar62) * dVar155 + dVar46 +
                                            (dVar94 + dVar103) * dVar45 +
                                            (dVar71 + dVar103) * dVar61 + 1e-100) +
                                           ((double)local_580[lVar19 + lVar25] * dVar47) /
                                           (dVar47 + (dVar195 + dVar182) * dVar149 +
                                                     (dVar172 + dVar195) * dVar102 +
                                            (dVar182 + dVar73) * dVar72 + 1e-100) +
                                           ((double)local_580[lVar39 + lVar25] * dVar171) /
                                           (dVar171 + (dVar88 + dVar194) * dVar70 +
                                                      (dVar189 + dVar148) * dVar181 +
                                                      (dVar88 + dVar189) * dVar60 + 1e-100) +
                                           ((double)local_270[local_5b0] * dVar101) /
                                           ((dVar93 + dVar87) * dVar129 + dVar101 +
                                            (dVar69 + dVar138) * dVar44 +
                                            (dVar87 + dVar138) * dVar117 + 1e-100) +
                                           (dVar128 * (double)local_260[local_5b0]) /
                                           ((dVar68 + dVar59) * dVar100 + dVar128 +
                                            (dVar68 + dVar137) * dVar92 +
                                            (dVar86 + dVar137) * dVar116 + 1e-100) +
                                           ((double)local_540[local_5b0] * dVar43) /
                                           (dVar43 + (dVar115 + dVar85) * dVar127 +
                                                     (dVar67 + dVar115) * dVar91 +
                                            (dVar85 + dVar136) * dVar99 + 1e-100) +
                                           ((double)local_538[local_5b0] * dVar98) /
                                           (dVar98 + (dVar66 + dVar135) * dVar58 +
                                                     (dVar126 + dVar84) * dVar114 +
                                                     (dVar66 + dVar126) * dVar90 + 1e-100) +
                                           (double)local_580[lVar37 + local_5b0] + dVar52 + dVar53 +
                                           dVar54 + dVar55 + dVar56 + dVar57 + auVar160._0_8_ +
                                 auVar89._0_8_) * 0.125;
                      local_528 = lVar32;
                    }
                    local_4a0[lVar32 - local_338] = dVar52;
                    lVar32 = lVar32 + 1;
                  } while (local_50c != (int)lVar32);
                }
                uVar7 = (uint)local_560 + 1;
                bVar42 = (uint)local_560 != local_5e4.bigend.vect[1];
                local_560 = (ulong)uVar7;
              } while (bVar42);
            }
            uVar7 = (uint)local_568 + 1;
            bVar42 = (uint)local_568 != local_5e4.bigend.vect[2];
            local_568 = (ulong)uVar7;
          } while (bVar42);
        }
      }
      MFIter::operator++((MFIter *)&local_218);
      pMVar35 = local_4c8;
    } while (local_218.m_bat.m_op.m_bndryReg.m_loshft.vect[2] <
             local_218.m_bat.m_op.m_bndryReg.m_hishft.vect[1]);
  }
  MFIter::~MFIter((MFIter *)&local_218);
  if (bVar40 || !bVar6) {
    period = Periodicity::NonPeriodic();
    FabArray<amrex::FArrayBox>::ParallelCopy(local_388,&local_1b0,period,COPY);
  }
  MultiFab::~MultiFab((MultiFab *)&local_1b0);
  return;
}

Assistant:

void
MLNodeLaplacian::restriction (int amrlev, int cmglev, MultiFab& crse, MultiFab& fine) const
{
    BL_PROFILE("MLNodeLaplacian::restriction()");

    applyBC(amrlev, cmglev-1, fine, BCMode::Homogeneous, StateMode::Solution);

    bool need_parallel_copy = !amrex::isMFIterSafe(crse, fine);
    MultiFab cfine;
    if (need_parallel_copy) {
        const BoxArray& ba = amrex::coarsen(fine.boxArray(), 2);
        cfine.define(ba, fine.DistributionMap(), 1, 0);
    }

    MultiFab* pcrse = (need_parallel_copy) ? &cfine : &crse;
    const iMultiFab& dmsk = *m_dirichlet_mask[amrlev][cmglev-1];

    const auto& stencil = m_stencil[amrlev][cmglev-1];

    bool regular_coarsening = true; int idir = 2;
    if (cmglev > 0) {
        regular_coarsening = mg_coarsen_ratio_vec[cmglev-1] == mg_coarsen_ratio;
        IntVect ratio = mg_coarsen_ratio_vec[cmglev-1];
        if (ratio[1] == 1) {
            idir = 1;
        } else if (ratio[0] == 1) {
            idir = 0;
        }
    }

#ifdef AMREX_USE_GPU
    auto pcrse_ma = pcrse->arrays();
    auto fine_ma = fine.const_arrays();
    auto msk_ma = dmsk.const_arrays();

    if (Gpu::inLaunchRegion()) {
        if (m_coarsening_strategy == CoarseningStrategy::Sigma)
        {
            if (regular_coarsening)
            {
                ParallelFor(*pcrse, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
                {
                    mlndlap_restriction(i,j,k,pcrse_ma[box_no],fine_ma[box_no],msk_ma[box_no]);
                });
            }
            else
            {
                ParallelFor(*pcrse, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
                {
                    mlndlap_semi_restriction(i,j,k,pcrse_ma[box_no],fine_ma[box_no],msk_ma[box_no],idir);
                });
            }
        }
        else
        {
            auto st_ma = stencil->const_arrays();
            ParallelFor(*pcrse, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
            {
                mlndlap_restriction_rap(i,j,k,pcrse_ma[box_no],fine_ma[box_no],st_ma[box_no],msk_ma[box_no]);
            });
        }
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(*pcrse, TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> cfab = pcrse->array(mfi);
            Array4<Real const> const& ffab = fine.const_array(mfi);
            Array4<int const> const& mfab = dmsk.const_array(mfi);
            if (m_coarsening_strategy == CoarseningStrategy::Sigma)
            {
                if (regular_coarsening)
                {
                    amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                    {
                        mlndlap_restriction(i,j,k,cfab,ffab,mfab);
                    });
                }
                else
                {
                    amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                    {
                        mlndlap_semi_restriction(i,j,k,cfab,ffab,mfab,idir);
                    });
                }
            }
            else
            {
                Array4<Real const> const& stfab = stencil->const_array(mfi);
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    mlndlap_restriction_rap(i,j,k,cfab,ffab,stfab,mfab);
                });
            }
        }
    }

    if (need_parallel_copy) {
        crse.ParallelCopy(cfine);
    }
}